

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

size_t Catch::listReporters(Config *param_1)

{
  _Rb_tree_node_base *p_Var1;
  pointer pbVar2;
  int iVar3;
  IRegistryHub *pIVar4;
  undefined4 extraout_var;
  long lVar5;
  _Rb_tree_node_base *p_Var6;
  ostream *poVar7;
  _Rb_tree_node_base *p_Var8;
  pointer pbVar9;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  undefined1 local_e8 [8];
  Text wrapper;
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Available reporters:\n",0x15);
  pIVar4 = getRegistryHub();
  iVar3 = (*pIVar4->_vptr_IRegistryHub[2])(pIVar4);
  lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x18))
                    ((long *)CONCAT44(extraout_var,iVar3));
  p_Var8 = *(_Rb_tree_node_base **)(lVar5 + 0x18);
  p_Var1 = (_Rb_tree_node_base *)(lVar5 + 8);
  if (p_Var8 != p_Var1) {
    p_Var6 = p_Var8;
    p_Var10 = (_Base_ptr)0x0;
    do {
      p_Var11 = p_Var6[1]._M_parent;
      if (p_Var6[1]._M_parent < p_Var10) {
        p_Var11 = p_Var10;
      }
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
      p_Var10 = p_Var11;
    } while (p_Var6 != p_Var1);
    if (p_Var8 != p_Var1) {
      do {
        (**(code **)(**(long **)(p_Var8 + 2) + 0x18))(&local_50);
        wrapper.lines.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        Tbc::Text::Text((Text *)local_e8,&local_50,
                        (TextAttributes *)
                        &wrapper.lines.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,*(char **)(p_Var8 + 1),(long)p_Var8[1]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_50,((char)p_Var11 + '\x02') - (char)p_Var8[1]._M_parent);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_50._M_dataplus._M_p,local_50._M_string_length);
        pbVar2 = wrapper.lines.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        for (pbVar9 = (pointer)wrapper.attr._24_8_; pbVar9 != pbVar2; pbVar9 = pbVar9 + 1) {
          if (pbVar9 != (pointer)wrapper.attr._24_8_) {
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,(pbVar9->_M_dataplus)._M_p,pbVar9->_M_string_length);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&wrapper.attr.tabChar);
        if (local_e8 != (undefined1  [8])&wrapper.str._M_string_length) {
          operator_delete((void *)local_e8);
        }
        p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
      } while (p_Var8 != p_Var1);
    }
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  return *(size_t *)(lVar5 + 0x28);
}

Assistant:

inline std::size_t listReporters( Config const& /*config*/ ) {
        Catch::cout() << "Available reporters:\n";
        IReporterRegistry::FactoryMap const& factories = getRegistryHub().getReporterRegistry().getFactories();
        IReporterRegistry::FactoryMap::const_iterator itBegin = factories.begin(), itEnd = factories.end(), it;
        std::size_t maxNameLen = 0;
        for(it = itBegin; it != itEnd; ++it )
            maxNameLen = (std::max)( maxNameLen, it->first.size() );

        for(it = itBegin; it != itEnd; ++it ) {
            Text wrapper( it->second->getDescription(), TextAttributes()
                                                        .setInitialIndent( 0 )
                                                        .setIndent( 7+maxNameLen )
                                                        .setWidth( CATCH_CONFIG_CONSOLE_WIDTH - maxNameLen-8 ) );
            Catch::cout() << "  "
                    << it->first
                    << ":"
                    << std::string( maxNameLen - it->first.size() + 2, ' ' )
                    << wrapper << "\n";
        }
        Catch::cout() << std::endl;
        return factories.size();
    }